

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  cmLocalGenerator *pcVar1;
  cmMakefile *pcVar2;
  undefined8 __s;
  TargetType TVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  pointer pcVar7;
  string *psVar8;
  cmGlobalGenerator *pcVar9;
  bool bVar10;
  byte local_3ba;
  allocator<char> local_2b1;
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [8];
  string suffix;
  undefined1 local_260 [7];
  bool useEPN;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  cge_1;
  undefined1 local_1b0 [8];
  cmGeneratorExpression ge_1;
  string local_198;
  char *local_178;
  char *outdir;
  undefined1 local_150 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_130 [8];
  cmGeneratorExpression ge;
  string local_118;
  char *local_f8;
  char *config_outdir;
  string configPropStr;
  char *configProp;
  string configUpper;
  string propertyNameStr;
  char *propertyName;
  string local_70 [8];
  string targetTypeName;
  string conf;
  bool usesDefaultOutputDir;
  string *out_local;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  std::__cxx11::string::string((string *)(targetTypeName.field_2._M_local_buf + 8),(string *)config)
  ;
  pcVar5 = GetOutputTargetType(this,artifact);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,pcVar5,(allocator<char> *)((long)&propertyName + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&propertyName + 3));
  propertyNameStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(configUpper.field_2._M_local_buf + 8),local_70);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)(configUpper.field_2._M_local_buf + 8),"_OUTPUT_DIRECTORY");
    propertyNameStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  cmsys::SystemTools::UpperCase((string *)&configProp,(string *)((long)&targetTypeName.field_2 + 8))
  ;
  configPropStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&config_outdir,local_70);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&config_outdir,"_OUTPUT_DIRECTORY_");
    std::__cxx11::string::operator+=((string *)&config_outdir,(string *)&configProp);
    configPropStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  __s = configPropStr.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,(char *)__s,
             (allocator<char> *)
             ((long)&ge.Backtrace.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  pcVar5 = GetProperty(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ge.Backtrace.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  local_f8 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,(char *)propertyNameStr.field_2._8_8_,
               (allocator<char> *)
               ((long)&ge_1.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    pcVar5 = GetProperty(this,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ge_1.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    local_178 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      TVar3 = GetType(this);
      if (TVar3 == EXECUTABLE) {
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"EXECUTABLE_OUTPUT_PATH",&local_211);
        psVar8 = cmMakefile::GetSafeDefinition(pcVar2,&local_210);
        std::__cxx11::string::operator=((string *)out,(string *)psVar8);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator(&local_211);
      }
      else {
        TVar3 = GetType(this);
        if (((TVar3 == STATIC_LIBRARY) || (TVar3 = GetType(this), TVar3 == SHARED_LIBRARY)) ||
           (TVar3 = GetType(this), TVar3 == MODULE_LIBRARY)) {
          pcVar2 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,"LIBRARY_OUTPUT_PATH",&local_239);
          psVar8 = cmMakefile::GetSafeDefinition(pcVar2,&local_238);
          std::__cxx11::string::operator=((string *)out,(string *)psVar8);
          std::__cxx11::string::~string((string *)&local_238);
          std::allocator<char>::~allocator(&local_239);
        }
      }
    }
    else {
      cge_1._M_t.
      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
            )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              )0x0;
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge_1);
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_1b0,(cmListFileBacktrace *)&cge_1);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge_1);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_1d0,local_1b0);
      pcVar7 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)local_1d0);
      pcVar1 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_1f0);
      psVar8 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar7,pcVar1,config,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_1f0
                         );
      std::__cxx11::string::operator=((string *)out,(string *)psVar8);
      std::__cxx11::string::~string((string *)&local_1f0);
      bVar10 = std::operator!=(out,local_178);
      if (bVar10) {
        std::__cxx11::string::clear();
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)local_1d0);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_1b0);
    }
  }
  else {
    cge._M_t.
    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_130,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_150,local_130);
    pcVar7 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_150);
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&outdir);
    psVar8 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar7,pcVar1,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0
                        ,(cmGeneratorExpressionDAGChecker *)0x0,(string *)&outdir);
    std::__cxx11::string::operator=((string *)out,(string *)psVar8);
    std::__cxx11::string::~string((string *)&outdir);
    std::__cxx11::string::clear();
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_150);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_130);
  }
  uVar6 = std::__cxx11::string::empty();
  bVar10 = (uVar6 & 1) != 0;
  if (bVar10) {
    std::__cxx11::string::operator=((string *)out,".");
  }
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath((string *)local_260,out,psVar8);
  std::__cxx11::string::operator=((string *)out,(string *)local_260);
  std::__cxx11::string::~string((string *)local_260);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])
                      (this->GlobalGenerator,this->Makefile);
    suffix.field_2._M_local_buf[0xf] = (byte)iVar4 & 1;
    local_3ba = 0;
    if (bVar10) {
      local_3ba = suffix.field_2._M_local_buf[0xf];
    }
    pcVar5 = "";
    if (local_3ba != 0) {
      pcVar5 = "${EFFECTIVE_PLATFORM_NAME}";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_288,pcVar5,&local_289);
    std::allocator<char>::~allocator(&local_289);
    pcVar9 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2b0,"/",&local_2b1);
    (*pcVar9->_vptr_cmGlobalGenerator[0x16])
              (pcVar9,local_2b0,(undefined1 *)((long)&targetTypeName.field_2 + 8),local_288,out);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::__cxx11::string::~string(local_288);
  }
  std::__cxx11::string::~string((string *)&config_outdir);
  std::__cxx11::string::~string((string *)&configProp);
  std::__cxx11::string::~string((string *)(configUpper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)(targetTypeName.field_2._M_local_buf + 8));
  return bVar10;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  const char* propertyName = nullptr;
  std::string propertyNameStr = targetTypeName;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = nullptr;
  std::string configPropStr = targetTypeName;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir) {
      conf.clear();
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}